

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_tree_nodes.h
# Opt level: O2

node_type * __thiscall
st_tree::detail::
node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>
::_copy_data(node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>
             *this,tree_type *tree_)

{
  node_type *pnVar1;
  _Base_ptr p_Var2;
  tree_type *tree__00;
  node_type *c;
  node_type *local_30;
  
  pnVar1 = tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>::_new_node
                     ((tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_> *)
                      this);
  tree__00 = (tree_type *)
             &(this->
              super_node_base<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>,_std::multiset<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_st_tree::detail::ptr_less_data<std::less<str1>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>_>
              )._data;
  ut_ordered::emplace_subnodes::test_method::str1::operator=
            (&(pnVar1->
              super_node_base<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>,_std::multiset<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_st_tree::detail::ptr_less_data<std::less<str1>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>_>
              )._data,(str1 *)tree__00);
  if (pnVar1 != this) {
    (pnVar1->
    super_node_base<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>,_std::multiset<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_st_tree::detail::ptr_less_data<std::less<str1>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>_>
    )._depth._max =
         (this->
         super_node_base<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>,_std::multiset<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_st_tree::detail::ptr_less_data<std::less<str1>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>_>
         )._depth._max;
    tree__00 = (tree_type *)
               &(this->
                super_node_base<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>,_std::multiset<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_st_tree::detail::ptr_less_data<std::less<str1>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>_>
                )._depth._hist;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (&(pnVar1->
                super_node_base<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>,_std::multiset<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_st_tree::detail::ptr_less_data<std::less<str1>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>_>
                )._depth._hist,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)tree__00);
  }
  for (p_Var2 = (this->
                super_node_base<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>,_std::multiset<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_st_tree::detail::ptr_less_data<std::less<str1>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>_>
                )._children._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 !=
      &(this->
       super_node_base<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>,_std::multiset<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_st_tree::detail::ptr_less_data<std::less<str1>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>_>
       )._children._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    local_30 = _copy_data(*(node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>
                            **)(p_Var2 + 1),tree__00);
    tree__00 = (tree_type *)&local_30;
    std::
    multiset<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_st_tree::detail::ptr_less_data<std::less<str1>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>
    ::insert(&(pnVar1->
              super_node_base<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>,_std::multiset<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_st_tree::detail::ptr_less_data<std::less<str1>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>_>
              )._children,(value_type *)&local_30);
  }
  return pnVar1;
}

Assistant:

node_type* _copy_data(tree_type& tree_) const {
        node_type* n = tree_._new_node();
        n->_data = this->_data;
        n->_depth = this->_depth;
        for (cs_const_iterator j(this->_children.begin());  j != this->_children.end();  ++j) {
            node_type* c((*j)->_copy_data(tree_));
            n->_children.insert(c);
        }
        return n;
    }